

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_map.c
# Opt level: O0

Value removeKey(VM *vm,ObjMap *objMap,Value key)

{
  Entry *pEVar1;
  Value VVar2;
  Value key_00;
  uint32_t local_64;
  uint32_t newCapacity;
  uint uStack_4c;
  Entry *entry;
  ObjMap *objMap_local;
  VM *vm_local;
  Value key_local;
  Value value;
  
  key_00._4_4_ = 0;
  key_00.type = key.type;
  key_00.field_1.num = key.field_1.num;
  pEVar1 = findEntry(objMap,key_00);
  if (pEVar1 == (Entry *)0x0) {
    key_local.field_1.num = 4.94065645841247e-324;
    value.type = VT_UNDEFINED;
    value._4_4_ = 0;
  }
  else {
    key_local.field_1 = *(anon_union_8_2_14f5a2bf_for_Value_1 *)&pEVar1->value;
    value._0_8_ = (pEVar1->value).field_1;
    *(ulong *)&pEVar1->key = (ulong)uStack_4c << 0x20;
    (pEVar1->key).field_1.num = 0.0;
    *(ulong *)&pEVar1->value = CONCAT44(newCapacity,3);
    (pEVar1->value).field_1.num = 0.0;
    objMap->count = objMap->count - 1;
    if (objMap->count == 0) {
      clearMap(vm,objMap);
    }
    else if (((double)objMap->count < (double)(objMap->capacity >> 2) * 0.8) &&
            (0x40 < objMap->count)) {
      local_64 = objMap->capacity >> 2;
      if (local_64 < 0x40) {
        local_64 = 0x40;
      }
      resizeMap(vm,objMap,local_64);
    }
  }
  VVar2._0_8_ = (ulong)key_local.field_1.objHeader & 0xffffffff;
  VVar2.field_1 = (anon_union_8_2_14f5a2bf_for_Value_1)value._0_8_;
  return VVar2;
}

Assistant:

Value removeKey(VM *vm, ObjMap *objMap, Value key) {
    Entry *entry = findEntry(objMap, key);

    if (entry == NULL) {
        return VT_TO_VALUE(VT_NULL);
    }

    // 开放定址的伪删除
    Value value = entry->value;
    entry->key = VT_TO_VALUE(VT_UNDEFINED);
    entry->value = VT_TO_VALUE(VT_TRUE); // 值为真,伪删除

    objMap->count--;
    if (objMap->count == 0) { // 若删除该entry后map为空就回收该空间
        clearMap(vm, objMap);
    } else if (objMap->count < objMap->capacity / (CAPACITY_GROW_FACTOR) * MAP_LOAD_PERCENT &&
               objMap->count > MIN_CAPACITY) { // 若map容量利用率太低,缩小map空间
        uint32_t newCapacity = objMap->capacity / CAPACITY_GROW_FACTOR;
        if (newCapacity < MIN_CAPACITY) {
            newCapacity = MIN_CAPACITY;
        }
        resizeMap(vm, objMap, newCapacity);
    }

    return value;
}